

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

bool __thiscall
GdlGlyphClassDefn::CheckRecursiveGlyphClasses
          (GdlGlyphClassDefn *this,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcStack)

{
  ulong uVar1;
  pointer *pppGVar2;
  pointer ppGVar3;
  iterator __position;
  pointer pcVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  pointer ppGVar8;
  ulong uVar9;
  bool bVar10;
  string local_88;
  string local_68;
  GdlObject *local_48;
  pointer local_40;
  GdlGlyphClassDefn *local_38;
  
  ppGVar3 = (vpglfcStack->
            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (vpglfcStack->super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  bVar10 = (long)__position._M_current - (long)ppGVar3 != 0;
  if (bVar10) {
    uVar7 = (long)__position._M_current - (long)ppGVar3 >> 3;
    if (*ppGVar3 != this) {
      uVar9 = 0;
      do {
        if ((uVar7 + (uVar7 == 0)) - 1 == uVar9) goto LAB_00125a4c;
        uVar1 = uVar9 + 1;
        lVar5 = uVar9 + 1;
        uVar9 = uVar1;
      } while (ppGVar3[lVar5] != this);
      bVar10 = uVar1 < uVar7;
    }
    if (bVar10) {
      return false;
    }
  }
LAB_00125a4c:
  local_38 = this;
  if (__position._M_current ==
      (vpglfcStack->super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>>::
    _M_realloc_insert<GdlGlyphClassDefn*>
              ((vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *)vpglfcStack,
               __position,&local_38);
  }
  else {
    *__position._M_current = this;
    pppGVar2 = &(vpglfcStack->
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppGVar2 = *pppGVar2 + 1;
  }
  ppGVar8 = (this->m_vpglfdMembers).
            super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->m_vpglfdMembers).
             super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  bVar10 = ppGVar8 == local_40;
  if (!bVar10) {
    local_48 = &(this->super_GdlGlyphClassMember).super_GdlDefn.super_GdlObject;
    do {
      iVar6 = (*((*ppGVar8)->super_GdlDefn)._vptr_GdlDefn[2])(*ppGVar8,vpglfcStack);
      if ((char)iVar6 == '\0') {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Recursive class definition: ","");
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar4 = (this->m_staName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar4,pcVar4 + (this->m_staName)._M_string_length);
        GrcErrorList::AddItem
                  (&g_errorList,true,0x1034,local_48,(GrpLineAndFile *)0x0,&local_68,&local_88,
                   (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (!bVar10) {
          return false;
        }
        break;
      }
      ppGVar8 = ppGVar8 + 1;
      bVar10 = ppGVar8 == local_40;
    } while (!bVar10);
  }
  pppGVar2 = &(vpglfcStack->
              super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>)._M_impl
              .super__Vector_impl_data._M_finish;
  *pppGVar2 = *pppGVar2 + -1;
  return true;
}

Assistant:

bool GdlGlyphClassDefn::CheckRecursiveGlyphClasses(std::vector<GdlGlyphClassDefn*> & vpglfcStack)
{
	for (size_t iglfd = 0; iglfd < vpglfcStack.size(); iglfd++)
	{
		if (vpglfcStack[iglfd] == this)
			return false;
	}

	vpglfcStack.push_back(this);
	for (auto const pglfd: m_vpglfdMembers)
	{
		if (!pglfd->CheckRecursiveGlyphClasses(vpglfcStack))
		{
			g_errorList.AddError(4148, this, "Recursive class definition: ", this->Name());
			return false;
		}
	}
	vpglfcStack.pop_back();

	return true;
}